

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  SeekHead *pSVar1;
  bool bVar2;
  long lVar3;
  Entry *pEVar4;
  VoidElement *pVVar5;
  long lVar6;
  long unaff_R14;
  longlong idpos;
  long lVar7;
  longlong pos;
  longlong size;
  longlong id;
  uint local_64;
  long local_60;
  uint local_54;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  SeekHead *local_38;
  
  local_48 = this->m_pSegment->m_pReader;
  local_60 = this->m_start;
  lVar7 = local_60 + this->m_size;
  local_54 = 0;
  local_64 = 0;
  local_38 = this;
  while (pSVar1 = local_38, local_60 < lVar7) {
    lVar3 = ParseElementHeader(local_48,&local_60,lVar7,&local_40,&local_50);
    if (lVar3 < 0) {
      bVar2 = false;
    }
    else {
      if (local_40 == 0xec) {
        local_54 = local_54 + 1;
      }
      else if (local_40 == 0x4dbb) {
        local_64 = local_64 + 1;
      }
      local_60 = local_60 + local_50;
      bVar2 = local_60 <= lVar7;
      lVar3 = unaff_R14;
      if (lVar7 < local_60) {
        lVar3 = -2;
      }
    }
    unaff_R14 = lVar3;
    if (!bVar2) {
      return lVar3;
    }
  }
  if (local_60 != lVar7) {
    return -2;
  }
  if (0 < (int)local_64) {
    pEVar4 = (Entry *)operator_new__((ulong)local_64 << 5,(nothrow_t *)&std::nothrow);
    if (pEVar4 == (Entry *)0x0) {
      pEVar4 = (Entry *)0x0;
    }
    else {
      memset(pEVar4,0,(ulong)local_64 << 5);
    }
    pSVar1->m_entries = pEVar4;
    if (pEVar4 == (Entry *)0x0) {
      return -1;
    }
  }
  if (0 < (int)local_54) {
    pVVar5 = (VoidElement *)operator_new__((ulong)local_54 << 4,(nothrow_t *)&std::nothrow);
    pSVar1->m_void_elements = pVVar5;
    if (pVVar5 == (VoidElement *)0x0) {
      return -1;
    }
  }
  local_60 = pSVar1->m_start;
  pEVar4 = pSVar1->m_entries;
  pVVar5 = pSVar1->m_void_elements;
  while (lVar3 = local_60, local_60 < lVar7) {
    lVar6 = ParseElementHeader(local_48,&local_60,lVar7,&local_40,&local_50);
    if (lVar6 < 0) {
      bVar2 = false;
    }
    else {
      if (local_40 == 0x4dbb && 0 < (int)local_64) {
        bVar2 = ParseEntry(local_48,local_60,local_50,pEVar4);
        if (bVar2) {
          pEVar4->element_start = lVar3;
          pEVar4->element_size = (local_60 - lVar3) + local_50;
          pEVar4 = pEVar4 + 1;
        }
      }
      else if (local_40 == 0xec && 0 < (int)local_54) {
        pVVar5->element_start = lVar3;
        pVVar5->element_size = (local_60 - lVar3) + local_50;
        pVVar5 = pVVar5 + 1;
      }
      local_60 = local_60 + local_50;
      bVar2 = local_60 <= lVar7;
      lVar6 = unaff_R14;
      if (lVar7 < local_60) {
        lVar6 = -2;
      }
    }
    unaff_R14 = lVar6;
    if (!bVar2) {
      return lVar6;
    }
  }
  if (local_60 != lVar7) {
    return -2;
  }
  lVar7 = (long)pEVar4 - (long)local_38->m_entries >> 5;
  if (lVar7 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63c,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)local_64 < lVar7) {
    __assert_fail("count_ <= entry_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63d,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_entry_count = (int)lVar7;
  lVar7 = (long)pVVar5 - (long)local_38->m_void_elements >> 4;
  if (lVar7 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x642,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)local_54 < lVar7) {
    __assert_fail("count_ <= void_element_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x643,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_void_element_count = (int)lVar7;
  return 0;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  int entry_count = 0;
  int void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek)
      ++entry_count;
    else if (id == libwebm::kMkvVoid)
      ++void_element_count;

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[entry_count];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements = new (std::nothrow) VoidElement[void_element_count];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(count_ <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(count_ <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}